

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFObjectHandle::newStream(QPDFObjectHandle *this,QPDF *qpdf,shared_ptr<Buffer> *data)

{
  shared_ptr<Buffer> *data_00;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  shared_ptr<Buffer> local_40 [2];
  shared_ptr<Buffer> *local_20;
  shared_ptr<Buffer> *data_local;
  QPDF *qpdf_local;
  
  local_20 = data;
  data_local = (shared_ptr<Buffer> *)qpdf;
  qpdf_local = (QPDF *)this;
  if (qpdf == (QPDF *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"attempt to create stream in null qpdf object");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  QTC::TC("qpdf","QPDFObjectHandle newStream with data",0);
  data_00 = data_local;
  std::shared_ptr<Buffer>::shared_ptr(local_40,data);
  QPDF::newStream((QPDF *)this,data_00);
  std::shared_ptr<Buffer>::~shared_ptr(local_40);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newStream(QPDF* qpdf, std::shared_ptr<Buffer> data)
{
    if (qpdf == nullptr) {
        throw std::runtime_error("attempt to create stream in null qpdf object");
    }
    QTC::TC("qpdf", "QPDFObjectHandle newStream with data");
    return qpdf->newStream(data);
}